

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash2012.c
# Opt level: O2

void gost2012_hash_block(gost2012_hash_ctx *CTX,uchar *data,size_t len)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  unsigned_long_long uVar4;
  unsigned_long_long uVar5;
  unsigned_long_long uVar6;
  unsigned_long_long uVar7;
  ulong __n;
  size_t sVar8;
  
  sVar8 = CTX->bufsize;
  if (0x3f < len && sVar8 == 0) {
    do {
      uVar1 = *(unsigned_long_long *)data;
      uVar2 = *(unsigned_long_long *)((long)data + 8);
      uVar3 = *(unsigned_long_long *)((long)data + 0x10);
      uVar4 = *(unsigned_long_long *)((long)data + 0x18);
      uVar5 = *(unsigned_long_long *)((long)data + 0x20);
      uVar6 = *(unsigned_long_long *)((long)data + 0x28);
      uVar7 = *(unsigned_long_long *)((long)data + 0x38);
      (CTX->buffer).QWORD[6] = *(unsigned_long_long *)((long)data + 0x30);
      (CTX->buffer).QWORD[7] = uVar7;
      (CTX->buffer).QWORD[4] = uVar5;
      (CTX->buffer).QWORD[5] = uVar6;
      (CTX->buffer).QWORD[2] = uVar3;
      (CTX->buffer).QWORD[3] = uVar4;
      (CTX->buffer).QWORD[0] = uVar1;
      (CTX->buffer).QWORD[1] = uVar2;
      stage2(CTX,&CTX->buffer);
      data = (uchar *)((long)data + 0x40);
      len = len - 0x40;
    } while (0x3f < len);
  }
  while (len != 0) {
    __n = 0x40 - sVar8;
    if (len <= 0x40 - sVar8) {
      __n = len;
    }
    memcpy((void *)((long)&CTX->buffer + sVar8),data,__n);
    sVar8 = sVar8 + __n;
    len = len - __n;
    data = (uchar *)((long)data + __n);
    if (sVar8 == 0x40) {
      stage2(CTX,&CTX->buffer);
      sVar8 = 0;
    }
  }
  CTX->bufsize = sVar8;
  return;
}

Assistant:

void gost2012_hash_block(gost2012_hash_ctx * CTX,
                         const unsigned char *data, size_t len)
{
    register size_t bufsize = CTX->bufsize;

    if (bufsize == 0) {
        while (len >= 64) {
            memcpy(&CTX->buffer.B[0], data, 64);
            stage2(CTX, &(CTX->buffer));
            data += 64;
            len -= 64;
        }
    }

    while (len) {
        register size_t chunksize = 64 - bufsize;
        if (chunksize > len)
            chunksize = len;

        memcpy(&CTX->buffer.B[bufsize], data, chunksize);

        bufsize += chunksize;
        len -= chunksize;
        data += chunksize;

        if (bufsize == 64) {
            stage2(CTX, &(CTX->buffer) );
            bufsize = 0;
        }
    }
    CTX->bufsize = bufsize;
}